

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4be406::PpuTest_visible_scanline_output_background_left_disabled_Test::TestBody
          (PpuTest_visible_scanline_output_background_left_disabled_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  Type TVar1;
  char extraout_var;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar2;
  ActionInterface<unsigned_char_(unsigned_short)> *pAVar3;
  _func_int *message;
  char *in_R9;
  uint uVar4;
  Color expected_color;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  optional<n_e_s::core::Pixel> pixel;
  AssertHelper local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_98 [16];
  _Manager_type local_88;
  undefined1 local_78 [8];
  undefined1 local_70 [24];
  undefined1 local_58 [8];
  MatcherBase<unsigned_short> local_50;
  PpuTest_visible_scanline_output_background_left_disabled_Test *local_38;
  
  (this->super_PpuTest).expected.mask.super_Register<unsigned_char>.value_ = '\b';
  (this->super_PpuTest).registers.mask.super_Register<unsigned_char>.value_ = '\b';
  (this->super_PpuTest).registers.cycle = 1;
  (this->super_PpuTest).registers.pattern_table_shifter_low = 0;
  (this->super_PpuTest).registers.pattern_table_shifter_hi = 0xffff;
  (this->super_PpuTest).registers.pattern_table_latch_hi = 0xff;
  (this->super_PpuTest).registers.attribute_table_shifter_low = 0xffff;
  (this->super_PpuTest).registers.attribute_table_shifter_hi = 0xffff;
  (this->super_PpuTest).registers.attribute_table_latch = 0xff;
  this_00 = &(this->super_PpuTest).mmu;
  local_50.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<unsigned_short>::
       GetVTable<testing::internal::MatcherBase<unsigned_short>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002a0c88;
  local_38 = this;
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_78,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_50);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_78,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x26b,"mmu","read_byte(testing::_)");
  local_a8.data_ = (AssertHelperData *)operator_new(4);
  (local_a8.data_)->type = 0xff;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            (&local_a0,(int *)local_a8.data_);
  pAVar3 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar3->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  TVar1 = (local_a8.data_)->type;
  *(Type *)&pAVar3[1]._vptr_ActionInterface = TVar1;
  *(char *)((long)&pAVar3[1]._vptr_ActionInterface + 4) = (char)TVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)local_98,pAVar3);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)local_70);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_50);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_50,0x3f00);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_78,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_50);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_78,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x26c,"mmu","read_byte(0x3F00)");
  local_a8.data_ = (AssertHelperData *)operator_new(4);
  (local_a8.data_)->type = 5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            (&local_a0,(int *)local_a8.data_);
  pAVar3 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar3->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  TVar1 = (local_a8.data_)->type;
  *(Type *)&pAVar3[1]._vptr_ActionInterface = TVar1;
  *(char *)((long)&pAVar3[1]._vptr_ActionInterface + 4) = (char)TVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)local_98,pAVar3);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)local_70);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_50);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_50,0x3f0e);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_78,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_50);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_78,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x26e,"mmu","read_byte(0x3F00 + 3u * 4u + 2u)");
  local_a8.data_ = (AssertHelperData *)operator_new(4);
  (local_a8.data_)->type = 6;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            (&local_a0,(int *)local_a8.data_);
  pAVar3 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar3->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  TVar1 = (local_a8.data_)->type;
  *(Type *)&pAVar3[1]._vptr_ActionInterface = TVar1;
  *(char *)((long)&pAVar3[1]._vptr_ActionInterface + 4) = (char)TVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)local_98,pAVar3);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)local_70);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_50);
  uVar4 = 0;
  do {
    local_58._0_4_ =
         (*((local_38->super_PpuTest).ppu._M_t.
            super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
            super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
            super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl)->_vptr_IPpu[4])();
    local_98._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_98[0] = extraout_var;
    if (extraout_var == '\0') {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)local_98,(AssertionResult *)"pixel.has_value()",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                 ,0x273,(char *)CONCAT71(local_78._1_7_,local_78[0]));
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if ((undefined1 *)CONCAT71(local_78._1_7_,local_78[0]) != local_70 + 8) {
        operator_delete((undefined1 *)CONCAT71(local_78._1_7_,local_78[0]),
                        (ulong)(local_70._8_8_ + 1));
      }
      if (local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
          (_func_int **)0x0) {
        (**(code **)(*local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))
                  ();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_98 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_98._8_8_);
    }
    if (uVar4 < 8) {
      local_a8.data_._0_3_ = 0x30005c;
    }
    else {
      local_a8.data_._0_3_ = 0x454;
    }
    testing::internal::CmpHelperEQ<n_e_s::core::Color,n_e_s::core::Color>
              ((internal *)local_78,"expected_color","pixel->color",(Color *)&local_a8,
               (Color *)(local_58 + 2));
    if (local_78[0] == '\0') {
      testing::Message::Message((Message *)local_98);
      message = (_func_int *)0x247c3a;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = *(_func_int **)local_70._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                 ,0x277,(char *)message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
      if ((long *)CONCAT71(local_98._1_7_,local_98[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_98._1_7_,local_98[0]) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_70._0_8_);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 10);
  return;
}

Assistant:

TEST_F(PpuTest, visible_scanline_output_background_left_disabled) {
    // Render background, but not first 8 pixels.
    registers.mask = expected.mask = PpuMask(0b0000'1000);
    registers.cycle = 1;
    registers.pattern_table_shifter_hi = 0b1111'1111'1111'1111;
    registers.pattern_table_shifter_low = 0b0000'0000'0000'0000u;
    registers.pattern_table_latch_hi = 0xFF;
    registers.attribute_table_shifter_hi = 0xFFFF;
    registers.attribute_table_shifter_low = 0xFFFF;
    registers.attribute_table_latch = 0xFF;

    EXPECT_CALL(mmu, read_byte(testing::_)).WillRepeatedly(Return(0xFF));
    EXPECT_CALL(mmu, read_byte(0x3F00)).WillRepeatedly(Return(0x05));
    // Third palette (from attribute)
    EXPECT_CALL(mmu, read_byte(0x3F00 + 3u * 4u + 2u))
            .WillRepeatedly(Return(0x06));

    for (int i = 0; i < 10; ++i) {
        const auto pixel = ppu->execute();
        EXPECT_TRUE(pixel.has_value());
        // Return 5th color first 8 pixels (background from 0x3F00)
        // and 6th color the following pixels.
        const auto expected_color = i < 8 ? Color{92, 0, 48} : Color{84, 4, 0};
        EXPECT_EQ(expected_color, pixel->color);
    }
}